

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O3

void QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
               (QRhiTextureRenderTargetDescription *desc,ResIdList *dst)

{
  void *pvVar1;
  QRhiResource *pQVar2;
  QRhiTexture *this;
  QRhiRenderBuffer *this_00;
  bool bVar3;
  quint64 qVar4;
  int iVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  QGles2RenderBuffer *depthRbD;
  QGles2Texture *texD;
  long lVar13;
  
  bVar3 = desc->m_depthTexture != (QRhiTexture *)0x0 ||
          desc->m_depthStencilBuffer != (QRhiRenderBuffer *)0x0;
  lVar13 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s * 2 +
           (ulong)bVar3;
  lVar10 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.a;
  if (lVar10 <= lVar13) {
    lVar10 = lVar13;
  }
  QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::reallocate_impl
            (&dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>,0x11,
             &dst->super_QVLAStorage<16UL,_8UL,_17LL>,lVar13,lVar10);
  (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.s = lVar13;
  lVar10 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s;
  if (lVar10 == 0) {
    uVar12 = 0;
  }
  else {
    pvVar1 = (desc->m_colorAttachments).super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr;
    lVar13 = 0;
    uVar11 = 0;
    puVar9 = (undefined8 *)((long)pvVar1 + 8);
    do {
      pQVar2 = (QRhiResource *)puVar9[-1];
      if (pQVar2 == (QRhiResource *)0x0) {
        pQVar2 = (QRhiResource *)*puVar9;
        if (pQVar2 == (QRhiResource *)0x0) {
          qVar4 = 0;
          uVar7 = 0;
        }
        else {
          qVar4 = QRhiResource::globalResourceId(pQVar2);
          uVar7 = (undefined4)pQVar2[1].m_objectName.d.size;
        }
      }
      else {
        qVar4 = QRhiResource::globalResourceId(pQVar2);
        uVar7 = *(undefined4 *)((long)&pQVar2[3].m_id + 4);
      }
      pvVar6 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.
               ptr;
      *(quint64 *)((long)pvVar6 + lVar13) = qVar4;
      *(undefined4 *)((long)pvVar6 + lVar13 + 8) = uVar7;
      pQVar2 = (QRhiResource *)puVar9[2];
      if (pQVar2 == (QRhiResource *)0x0) {
        qVar4 = 0;
        uVar7 = 0;
      }
      else {
        qVar4 = QRhiResource::globalResourceId(pQVar2);
        uVar7 = *(undefined4 *)((long)&pQVar2[3].m_id + 4);
        pvVar6 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.
                 ptr;
      }
      *(quint64 *)((long)pvVar6 + lVar13 + 0x10) = qVar4;
      *(undefined4 *)((long)pvVar6 + lVar13 + 0x18) = uVar7;
      uVar11 = uVar11 + 2;
      lVar13 = lVar13 + 0x20;
      puVar8 = puVar9 + 5;
      puVar9 = puVar9 + 6;
    } while (puVar8 != (undefined8 *)(lVar10 * 0x30 + (long)pvVar1));
    uVar12 = (ulong)uVar11;
  }
  if (bVar3) {
    this = desc->m_depthTexture;
    if (this == (QRhiTexture *)0x0) {
      this_00 = desc->m_depthStencilBuffer;
      if (this_00 == (QRhiRenderBuffer *)0x0) {
        qVar4 = 0;
        iVar5 = 0;
      }
      else {
        qVar4 = QRhiResource::globalResourceId(&this_00->super_QRhiResource);
        iVar5 = (int)this_00[1].super_QRhiResource.m_id;
      }
    }
    else {
      qVar4 = QRhiResource::globalResourceId(&this->super_QRhiResource);
      iVar5 = this[1].m_depth;
    }
    pvVar1 = (dst->super_QVLABase<QRhiRenderTargetAttachmentTracker::ResId>).super_QVLABaseBase.ptr;
    *(quint64 *)((long)pvVar1 + uVar12 * 0x10) = qVar4;
    *(int *)((long)pvVar1 + uVar12 * 0x10 + 8) = iVar5;
  }
  return;
}

Assistant:

void QRhiRenderTargetAttachmentTracker::updateResIdList(const QRhiTextureRenderTargetDescription &desc, ResIdList *dst)
{
    const bool hasDepthStencil = desc.depthStencilBuffer() || desc.depthTexture();
    dst->resize(desc.colorAttachmentCount() * 2 + (hasDepthStencil ? 1 : 0));
    int n = 0;
    for (auto it = desc.cbeginColorAttachments(), itEnd = desc.cendColorAttachments(); it != itEnd; ++it, ++n) {
        const QRhiColorAttachment &colorAtt(*it);
        if (colorAtt.texture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.texture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else if (colorAtt.renderBuffer()) {
            RenderBufferType *rbD = QRHI_RES(RenderBufferType, colorAtt.renderBuffer());
            (*dst)[n] = { rbD->globalResourceId(), rbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
        ++n;
        if (colorAtt.resolveTexture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.resolveTexture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
    if (hasDepthStencil) {
        if (desc.depthTexture()) {
            TexType *depthTexD = QRHI_RES(TexType, desc.depthTexture());
            (*dst)[n] = { depthTexD->globalResourceId(), depthTexD->generation };
        } else if (desc.depthStencilBuffer()) {
            RenderBufferType *depthRbD = QRHI_RES(RenderBufferType, desc.depthStencilBuffer());
            (*dst)[n] = { depthRbD->globalResourceId(), depthRbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
}